

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O2

void __thiscall
trun::ResultsReportConsole::PrintPasses
          (ResultsReportConsole *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<trun::TestResult> r;
  
  p_Var1 = &((results->
             super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
  bVar2 = false;
  for (p_Var3 = &((results->
                  super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>; p_Var3 != p_Var1;
      p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    if ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult ==
        kTestResult_Pass) {
      if (!bVar2) {
        fwrite("Success:\n",9,1,(FILE *)(this->super_ResultsReportPinterBase).fout);
      }
      fprintf((FILE *)(this->super_ResultsReportPinterBase).fout,"  [P--]: %s\n",
              ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              symbolName)._M_dataplus._M_p);
      bVar2 = true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintPasses(const std::vector<TestResult::Ref> &results) {
    bool haveHeader = false;
    for(auto r : results) {
        if (r->Result() == kTestResult_Pass) {
            // Only print this the first time - if we have any...
            if (!haveHeader) {
                fprintf(fout, "Success:\n");
                haveHeader = true;
            }
            fprintf(fout, "  [P--]: %s\n",r->SymbolName().c_str());
        }
    }
}